

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

short duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<int,short>
                (int input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  ushort uVar1;
  string sStack_48;
  
  if ((short)input != input) {
    CastExceptionText<int,short>(&sStack_48,(duckdb *)(ulong)(uint)input,(int)idx);
    uVar1 = HandleVectorCastError::Operation<short>
                      (&sStack_48,mask,idx,(VectorTryCastData *)dataptr);
    input = (int)uVar1;
    ::std::__cxx11::string::~string((string *)&sStack_48);
  }
  return (short)input;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}